

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

SoundAnalysisPreprocessing_Vggish *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>
          (Arena *arena)

{
  SoundAnalysisPreprocessing_Vggish *pSVar1;
  
  if (arena != (Arena *)0x0) {
    pSVar1 = DoCreateMessage<CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish>
                       (arena);
    return pSVar1;
  }
  pSVar1 = (SoundAnalysisPreprocessing_Vggish *)operator_new(0x18);
  CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing_Vggish::
  SoundAnalysisPreprocessing_Vggish(pSVar1,(Arena *)0x0,false);
  return pSVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }